

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayoutInfo::deleteAllLayoutItems(QDockAreaLayoutInfo *this)

{
  QDockAreaLayoutInfo *this_00;
  long *plVar1;
  pointer pQVar2;
  long lVar3;
  ulong uVar4;
  
  if ((this->item_list).d.size != 0) {
    lVar3 = 0;
    uVar4 = 0;
    do {
      pQVar2 = QList<QDockAreaLayoutItem>::data(&this->item_list);
      this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar2->subinfo + lVar3);
      if (this_00 == (QDockAreaLayoutInfo *)0x0) {
        plVar1 = *(long **)((long)&pQVar2->widgetItem + lVar3);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
        *(undefined8 *)((long)&pQVar2->widgetItem + lVar3) = 0;
      }
      else {
        deleteAllLayoutItems(this_00);
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x28;
    } while (uVar4 < (ulong)(this->item_list).d.size);
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::deleteAllLayoutItems()
{
    for (int i = 0; i < item_list.size(); ++i) {
        QDockAreaLayoutItem &item= item_list[i];
        if (item.subinfo) {
            item.subinfo->deleteAllLayoutItems();
        } else {
            delete item.widgetItem;
            item.widgetItem = nullptr;
        }
    }
}